

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void google::protobuf::compiler::cxx::anon_unknown_0::OptimizePadding
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *fields)

{
  pointer *this;
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppFVar4;
  LogMessage *other;
  reference pvVar5;
  iterator __first;
  iterator __last;
  long lVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar7;
  const_iterator __first_00;
  const_iterator __last_00;
  float fVar8;
  float local_21c;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_1a0;
  const_iterator local_198;
  int local_18c;
  iterator iStack_188;
  int i_3;
  __normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
  local_180;
  int local_174;
  undefined1 local_170 [4];
  int j_1;
  FieldGroup field_group_1;
  int i_2;
  int local_134;
  undefined1 local_130 [4];
  int j;
  FieldGroup field_group;
  int i_1;
  FieldGroup local_d0;
  FieldGroup local_b0;
  FieldGroup local_90;
  int local_5c;
  undefined1 local_58 [4];
  int i;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_8;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_4;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::vector((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            *)&aligned_to_4.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::vector((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            *)&aligned_to_8.
               super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::vector((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            *)local_58);
  for (local_5c = 0; uVar2 = (ulong)local_5c,
      sVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(fields), uVar2 < sVar3; local_5c = local_5c + 1) {
    ppFVar4 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](fields,(long)local_5c);
    iVar1 = EstimateAlignmentSize(*ppFVar4);
    if (iVar1 == 1) {
      fVar8 = (float)local_5c;
      ppFVar4 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](fields,(long)local_5c);
      FieldGroup::FieldGroup(&local_90,fVar8,*ppFVar4);
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   *)&aligned_to_4.
                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_90);
      FieldGroup::~FieldGroup(&local_90);
    }
    else if (iVar1 == 4) {
      fVar8 = (float)local_5c;
      ppFVar4 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](fields,(long)local_5c);
      FieldGroup::FieldGroup(&local_b0,fVar8,*ppFVar4);
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   *)&aligned_to_8.
                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0);
      FieldGroup::~FieldGroup(&local_b0);
    }
    else if (iVar1 == 8) {
      fVar8 = (float)local_5c;
      ppFVar4 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](fields,(long)local_5c);
      FieldGroup::FieldGroup(&local_d0,fVar8,*ppFVar4);
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::push_back((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   *)local_58,&local_d0);
      FieldGroup::~FieldGroup(&local_d0);
    }
    else {
      internal::LogMessage::LogMessage
                ((LogMessage *)&i_1,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                 ,0xf4);
      other = internal::LogMessage::operator<<((LogMessage *)&i_1,"Unknown alignment size.");
      internal::LogFinisher::operator=
                ((LogFinisher *)
                 ((long)&field_group.fields_.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),other);
      internal::LogMessage::~LogMessage((LogMessage *)&i_1);
    }
  }
  for (field_group.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      uVar2 = (ulong)(int)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
      sVar3 = std::
              vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
              ::size((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      *)&aligned_to_4.
                         super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar2 < sVar3;
      field_group.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)field_group.fields_.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) {
    FieldGroup::FieldGroup((FieldGroup *)local_130);
    for (local_134 = (int)field_group.fields_.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sVar3 = std::
                vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ::size((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                        *)&aligned_to_4.
                           super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
        (ulong)(long)local_134 < sVar3 &&
        local_134 <
        (int)field_group.fields_.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4; local_134 = local_134 + 1) {
      pvVar5 = std::
               vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ::operator[]((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                             *)&aligned_to_4.
                                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_134);
      FieldGroup::Append((FieldGroup *)local_130,pvVar5);
    }
    std::
    vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
    ::push_back((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                 *)&aligned_to_8.
                    super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_130);
    FieldGroup::~FieldGroup((FieldGroup *)local_130);
  }
  this = &aligned_to_8.
          super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __first = std::
            vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ::begin((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     *)this);
  __last = std::
           vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
           ::end((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                  *)this);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>>
            ((__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
              )__first._M_current,
             (__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
              )__last._M_current);
  for (field_group_1.fields_.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar2 = (ulong)field_group_1.fields_.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar3 = std::
              vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
              ::size((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      *)&aligned_to_8.
                         super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar2 < sVar3;
      field_group_1.fields_.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           field_group_1.fields_.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2) {
    FieldGroup::FieldGroup((FieldGroup *)local_170);
    for (local_174 = field_group_1.fields_.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        uVar2 = (ulong)local_174,
        sVar3 = std::
                vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ::size((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                        *)&aligned_to_8.
                           super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
        uVar2 < sVar3 &&
        local_174 <
        field_group_1.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 2; local_174 = local_174 + 1) {
      pvVar5 = std::
               vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ::operator[]((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                             *)&aligned_to_8.
                                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_174);
      FieldGroup::Append((FieldGroup *)local_170,pvVar5);
    }
    lVar6 = (long)field_group_1.fields_.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::
            vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
            ::size((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                    *)&aligned_to_8.
                       super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (lVar6 == sVar3 - 1) {
      sVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(fields);
      local_21c = (float)(sVar3 + 1);
      FieldGroup::SetPreferredLocation((FieldGroup *)local_170,local_21c);
    }
    std::
    vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
    ::push_back((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                 *)local_58,(value_type *)local_170);
    FieldGroup::~FieldGroup((FieldGroup *)local_170);
  }
  local_180._M_current =
       (FieldGroup *)
       std::
       vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
       ::begin((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                *)local_58);
  iStack_188 = std::
               vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
               ::end((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      *)local_58);
  std::
  sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>>
            (local_180,
             (__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
              )iStack_188._M_current);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::clear(fields);
  for (local_18c = 0; uVar2 = (ulong)local_18c,
      sVar3 = std::
              vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
              ::size((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      *)local_58), uVar2 < sVar3; local_18c = local_18c + 1) {
    local_1a0._M_current =
         (FieldDescriptor **)
         std::
         vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ::end(fields);
    __gnu_cxx::
    __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
    ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
              ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                *)&local_198,&local_1a0);
    pvVar5 = std::
             vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             ::operator[]((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                           *)local_58,(long)local_18c);
    pvVar7 = FieldGroup::fields(pvVar5);
    __first_00 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin(pvVar7);
    pvVar5 = std::
             vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             ::operator[]((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                           *)local_58,(long)local_18c);
    pvVar7 = FieldGroup::fields(pvVar5);
    __last_00 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::end(pvVar7);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::
    insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)fields,local_198,
               (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                )__first_00._M_current,
               (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                )__last_00._M_current);
  }
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             *)local_58);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             *)&aligned_to_8.
                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ::~vector((vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
             *)&aligned_to_4.
                super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void OptimizePadding(vector<const FieldDescriptor*>* fields) {
  // First divide fields into those that align to 1 byte, 4 bytes or 8 bytes.
  vector<FieldGroup> aligned_to_1, aligned_to_4, aligned_to_8;
  for (int i = 0; i < fields->size(); ++i) {
    switch (EstimateAlignmentSize((*fields)[i])) {
      case 1: aligned_to_1.push_back(FieldGroup(i, (*fields)[i])); break;
      case 4: aligned_to_4.push_back(FieldGroup(i, (*fields)[i])); break;
      case 8: aligned_to_8.push_back(FieldGroup(i, (*fields)[i])); break;
      default:
        GOOGLE_LOG(FATAL) << "Unknown alignment size.";
    }
  }

  // Now group fields aligned to 1 byte into sets of 4, and treat those like a
  // single field aligned to 4 bytes.
  for (int i = 0; i < aligned_to_1.size(); i += 4) {
    FieldGroup field_group;
    for (int j = i; j < aligned_to_1.size() && j < i + 4; ++j) {
      field_group.Append(aligned_to_1[j]);
    }
    aligned_to_4.push_back(field_group);
  }
  // Sort by preferred location to keep fields as close to their original
  // location as possible.
  sort(aligned_to_4.begin(), aligned_to_4.end());

  // Now group fields aligned to 4 bytes (or the 4-field groups created above)
  // into pairs, and treat those like a single field aligned to 8 bytes.
  for (int i = 0; i < aligned_to_4.size(); i += 2) {
    FieldGroup field_group;
    for (int j = i; j < aligned_to_4.size() && j < i + 2; ++j) {
      field_group.Append(aligned_to_4[j]);
    }
    if (i == aligned_to_4.size() - 1) {
      // Move incomplete 4-byte block to the end.
      field_group.SetPreferredLocation(fields->size() + 1);
    }
    aligned_to_8.push_back(field_group);
  }
  // Sort by preferred location to keep fields as close to their original
  // location as possible.
  sort(aligned_to_8.begin(), aligned_to_8.end());

  // Now pull out all the FieldDescriptors in order.
  fields->clear();
  for (int i = 0; i < aligned_to_8.size(); ++i) {
    fields->insert(fields->end(),
                   aligned_to_8[i].fields().begin(),
                   aligned_to_8[i].fields().end());
  }
}